

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionController_CalculateSimpleFeeTest_Test::TestBody
          (ConfidentialTransactionController_CalculateSimpleFeeTest_Test *this)

{
  bool bVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar2;
  AssertHelper local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  undefined8 local_78;
  undefined1 local_70;
  ConfidentialTransactionController tx;
  
  std::__cxx11::string::string
            ((string *)&local_78,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,(allocator *)&gtest_ar);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&tx,(string *)&local_78)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  cfd::core::Amount::Amount((Amount *)&local_78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_78 = cfd::ConfidentialTransactionController::CalculateSimpleFee(SUB81(&tx,0),true);
      local_70 = extraout_DL;
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x2f,
               "Expected: (amt = tx.CalculateSimpleFee()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_98.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_90.data_ = (AssertHelperData *)0x3e8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"amt.GetSatoshiValue()","static_cast<int64_t>(1000)",
             (long *)&local_98,(long *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_78 = cfd::ConfidentialTransactionController::CalculateSimpleFee(SUB81(&tx,0),false);
      local_70 = extraout_DL_00;
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x32,
               "Expected: (amt = tx.CalculateSimpleFee(false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_98.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_90.data_ = (AssertHelperData *)0x3e8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"amt.GetSatoshiValue()","static_cast<int64_t>(1000)",
             (long *)&local_98,(long *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, CalculateSimpleFeeTest)
{
  ConfidentialTransactionController tx(
      "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
  Amount amt;
  EXPECT_NO_THROW((amt = tx.CalculateSimpleFee()));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));

  EXPECT_NO_THROW((amt = tx.CalculateSimpleFee(false)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));
}